

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprAnalyzeAggregates(NameContext *pNC,Expr *pExpr)

{
  long in_FS_OFFSET;
  Walker local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.xExprCallback = analyzeAggregate;
  local_38.xSelectCallback = sqlite3WalkerDepthIncrease;
  local_38.xSelectCallback2 = sqlite3WalkerDepthDecrease;
  local_38.walkerDepth = 0;
  local_38.eCode = 0xaaaa;
  local_38.mWFlags = 0xaaaa;
  local_38.pParse = (Parse *)0x0;
  local_38.u.pNC = pNC;
  if (pExpr != (Expr *)0x0) {
    sqlite3WalkExprNN(&local_38,pExpr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAnalyzeAggregates(NameContext *pNC, Expr *pExpr){
  Walker w;
  w.xExprCallback = analyzeAggregate;
  w.xSelectCallback = sqlite3WalkerDepthIncrease;
  w.xSelectCallback2 = sqlite3WalkerDepthDecrease;
  w.walkerDepth = 0;
  w.u.pNC = pNC;
  w.pParse = 0;
  assert( pNC->pSrcList!=0 );
  sqlite3WalkExpr(&w, pExpr);
}